

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3DriverBase::draw2DRectangle
          (COpenGL3DriverBase *this,rect<int> *position,SColor colorLeftUp,SColor colorRightUp,
          SColor colorLeftDown,SColor colorRightDown,rect<int> *clip)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auStack_d4 [8];
  undefined1 auStack_cc [4];
  rect<int> pos;
  S3DVertex local_b8;
  float local_94;
  float local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  u32 local_7c;
  undefined8 local_78;
  float local_70;
  float local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  u32 local_58;
  undefined8 local_54;
  float local_4c;
  float local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  u32 local_34;
  undefined8 local_30;
  
  pos.UpperLeftCorner = position->UpperLeftCorner;
  pos.LowerRightCorner = position->LowerRightCorner;
  if (clip != (rect<int> *)0x0) {
    stack0xffffffffffffff30 = 0x20dac5;
    core::rect<int>::clipAgainst(&pos,clip);
  }
  if ((pos.UpperLeftCorner.X <= pos.LowerRightCorner.X) &&
     (pos.UpperLeftCorner.Y <= pos.LowerRightCorner.Y)) {
    stack0xffffffffffffff30 = 0x20dae8;
    chooseMaterial2D(this);
    stack0xffffffffffffff30 = 0x20daf4;
    setMaterialTexture(this,0,(ITexture *)0x0);
    stack0xffffffffffffff30 = 0x20db25;
    setRenderStates2DMode
              (this,(colorRightDown.color < 0xff000000 || colorLeftDown.color < 0xff000000) ||
                    (colorRightUp.color < 0xff000000 || colorLeftUp.color < 0xff000000),false,false)
    ;
    stack0xffffffffffffff30 = 0x20db31;
    iVar1 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])(this);
    fVar4 = (float)*(uint *)CONCAT44(extraout_var,iVar1);
    fVar3 = (float)pos.UpperLeftCorner.X / fVar4;
    fVar4 = (float)pos.LowerRightCorner.X / fVar4;
    fVar6 = (float)((uint *)CONCAT44(extraout_var,iVar1))[1];
    fVar5 = (float)pos.LowerRightCorner.Y / fVar6;
    fVar6 = (float)pos.UpperLeftCorner.Y / fVar6;
    lVar2 = 0x1c;
    do {
      *(undefined8 *)((long)&pos.UpperLeftCorner.Y + lVar2) = 0;
      *(undefined8 *)(auStack_d4 + lVar2) = 0;
      *(undefined8 *)(auStack_cc + lVar2) = 0;
      *(undefined4 *)((long)&pos.LowerRightCorner.Y + lVar2) = 0xffffffff;
      *(undefined8 *)((long)&local_b8.Pos.X + lVar2) = 0;
      lVar2 = lVar2 + 0x24;
    } while (lVar2 != 0xac);
    local_b8.Pos.X = fVar3 + fVar3 + -1.0;
    local_b8.Pos.Y = (2.0 - (fVar6 + fVar6)) + -1.0;
    local_b8.Pos.Z = 0.0;
    local_b8.Normal.X = 0.0;
    local_b8.Normal.Y = 0.0;
    local_b8.Normal.Z = 1.0;
    local_b8.TCoords.X = 0.0;
    local_b8.TCoords.Y = 0.0;
    local_94 = fVar4 + fVar4 + -1.0;
    local_8c = 0;
    uStack_84 = 0x3f80000000000000;
    local_78 = 0;
    local_6c = (2.0 - (fVar5 + fVar5)) + -1.0;
    local_68 = 0;
    uStack_60 = 0x3f80000000000000;
    local_54 = 0;
    local_44 = 0;
    uStack_3c = 0x3f80000000000000;
    local_30 = 0;
    stack0xffffffffffffff30 = 0x20dc45;
    local_b8.Color.color = colorLeftUp.color;
    local_90 = local_b8.Pos.Y;
    local_7c = colorRightUp.color;
    local_70 = local_94;
    local_58 = colorRightDown.color;
    local_4c = local_b8.Pos.X;
    local_48 = local_6c;
    local_34 = colorLeftDown.color;
    drawQuad(this,(VertexType *)vtPrimitive,(S3DVertex (*) [4])&local_b8);
  }
  return;
}

Assistant:

void COpenGL3DriverBase::draw2DRectangle(const core::rect<s32> &position,
		SColor colorLeftUp, SColor colorRightUp,
		SColor colorLeftDown, SColor colorRightDown,
		const core::rect<s32> *clip)
{
	core::rect<s32> pos = position;

	if (clip)
		pos.clipAgainst(*clip);

	if (!pos.isValid())
		return;

	chooseMaterial2D();
	setMaterialTexture(0, 0);

	setRenderStates2DMode(colorLeftUp.getAlpha() < 255 ||
								  colorRightUp.getAlpha() < 255 ||
								  colorLeftDown.getAlpha() < 255 ||
								  colorRightDown.getAlpha() < 255,
			false, false);

	const core::dimension2d<u32> &renderTargetSize = getCurrentRenderTargetSize();

	f32 left = (f32)pos.UpperLeftCorner.X / (f32)renderTargetSize.Width * 2.f - 1.f;
	f32 right = (f32)pos.LowerRightCorner.X / (f32)renderTargetSize.Width * 2.f - 1.f;
	f32 down = 2.f - (f32)pos.LowerRightCorner.Y / (f32)renderTargetSize.Height * 2.f - 1.f;
	f32 top = 2.f - (f32)pos.UpperLeftCorner.Y / (f32)renderTargetSize.Height * 2.f - 1.f;

	S3DVertex vertices[4];
	vertices[0] = S3DVertex(left, top, 0, 0, 0, 1, colorLeftUp, 0, 0);
	vertices[1] = S3DVertex(right, top, 0, 0, 0, 1, colorRightUp, 0, 0);
	vertices[2] = S3DVertex(right, down, 0, 0, 0, 1, colorRightDown, 0, 0);
	vertices[3] = S3DVertex(left, down, 0, 0, 0, 1, colorLeftDown, 0, 0);

	drawQuad(vtPrimitive, vertices);
}